

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

Connection * __thiscall Connection::readLine_abi_cxx11_(Connection *this)

{
  int *in_RSI;
  char local_1a [8];
  char ch;
  Connection *this_local;
  string *msg;
  
  local_1a[1] = 0;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  while (recv(*in_RSI,local_1a,1,0), local_1a[0] != '\n') {
    std::__cxx11::string::push_back((char)this);
  }
  return this;
}

Assistant:

string Connection::readLine() {
  string msg;  
  char ch;
  while (true) {
    recv(sock, &ch, 1, 0);
    if (ch == '\n')
      break;
    msg.push_back(ch);
  }
  return msg;
}